

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::AddToSpends(CWallet *this,COutPoint *outpoint,uint256 *wtxid,WalletBatch *batch)

{
  WalletDatabase *pWVar1;
  pointer *__ptr;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  range;
  WalletBatch local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  uint32_t local_58;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = outpoint->n;
  local_78.m_batch._M_t.
  super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t.
  super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
  super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl =
       *(__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
         *)(outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  local_78.m_database =
       *(WalletDatabase **)((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_68 = *(undefined8 *)
              ((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_60 = *(undefined8 *)
               ((outpoint->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  local_54 = *(undefined4 *)(wtxid->super_base_blob<256U>).m_data._M_elems;
  uStack_50 = *(undefined4 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 4);
  uStack_4c = *(undefined4 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 8);
  uStack_48 = *(undefined4 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 0xc);
  local_44 = *(undefined4 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_40 = *(undefined4 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 0x14);
  uStack_3c = *(undefined4 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 0x18);
  uStack_38 = *(undefined4 *)((wtxid->super_base_blob<256U>).m_data._M_elems + 0x1c);
  std::
  _Hashtable<COutPoint,std::pair<COutPoint_const,uint256>,std::allocator<std::pair<COutPoint_const,uint256>>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_M_emplace<std::pair<COutPoint,uint256>>
            ((_Hashtable<COutPoint,std::pair<COutPoint_const,uint256>,std::allocator<std::pair<COutPoint_const,uint256>>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&this->mapTxSpends,0,&local_78);
  if (batch == (WalletBatch *)0x0) {
    pWVar1 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    if (pWVar1 == (WalletDatabase *)0x0) {
      __assert_fail("static_cast<bool>(m_database)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                    ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
    }
    (*pWVar1->_vptr_WalletDatabase[0xe])(&local_78,pWVar1,1);
    local_78.m_database = pWVar1;
    UnlockCoin(this,outpoint,&local_78);
    if (local_78.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
      (**(code **)(*(long *)local_78.m_batch._M_t.
                            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl +
                  0x28))();
    }
  }
  else {
    UnlockCoin(this,outpoint,batch);
  }
  range = std::
          _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range(&(this->mapTxSpends)._M_h,outpoint);
  SyncMetaData(this,range);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::AddToSpends(const COutPoint& outpoint, const uint256& wtxid, WalletBatch* batch)
{
    mapTxSpends.insert(std::make_pair(outpoint, wtxid));

    if (batch) {
        UnlockCoin(outpoint, batch);
    } else {
        WalletBatch temp_batch(GetDatabase());
        UnlockCoin(outpoint, &temp_batch);
    }

    std::pair<TxSpends::iterator, TxSpends::iterator> range;
    range = mapTxSpends.equal_range(outpoint);
    SyncMetaData(range);
}